

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DEEP_DESCENT(effect_handler_context_t_conflict *context)

{
  uint32_t uVar1;
  level *lev;
  wchar_t target_place;
  wchar_t number;
  wchar_t i;
  effect_handler_context_t_conflict *context_local;
  
  lev._4_4_ = (wchar_t)player->place;
  target_place = L'\x05';
  while ((L'\0' < target_place && (world->levels[lev._4_4_].down != (char *)0x0))) {
    lev._4_4_ = player_get_next_place(lev._4_4_,"down",L'\x01');
    target_place = target_place + L'\xffffffff';
  }
  if ((int)player->depth < world->levels[lev._4_4_].depth) {
    msgt(0x19,"The air around you starts to swirl...");
    uVar1 = Rand_div(4);
    player->deep_descent = (short)uVar1 + 4;
    player->upkeep->redraw = player->upkeep->redraw | 0x2000;
    handle_stuff(player);
  }
  else {
    msgt(0x19,"You sense a malevolent presence blocking passage to the levels below.");
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DEEP_DESCENT(effect_handler_context_t *context)
{
	int i, number, target_place = player->place;
	struct level *lev;

	/* Calculate target place */
	//number = (4 / z_info->stair_skip) + 1;
	number = 1;
 	for (i = 5; i > 0; i--) {
		if (!world->levels[target_place].down) break;
		target_place = player_get_next_place(target_place, "down", number);
 	}

	lev = &world->levels[target_place];

	if (lev->depth > player->depth) {
		msgt(MSG_TPLEVEL, "The air around you starts to swirl...");
		player->deep_descent = 3 + randint1(4);

		/* Redraw status line */
		player->upkeep->redraw |= PR_STATUS;
		handle_stuff(player);
	} else {
		msgt(MSG_TPLEVEL, "You sense a malevolent presence blocking passage to the levels below.");
	}
	context->ident = true;
	return true;
}